

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O2

void __thiscall om::net::ip4_header::ip4_header(ip4_header *this,uchar *buf_)

{
  byte bVar1;
  
  (this->super_packet_header)._alloc = false;
  (this->super_packet_header)._buf = buf_;
  (this->super_packet_header)._len = 0;
  (this->super_packet_header)._vptr_packet_header = (_func_int **)&PTR__packet_header_001a4b38;
  this->_ip = (ip *)buf_;
  bVar1 = *buf_;
  if ((bVar1 & 0xf) != 5) {
    *buf_ = bVar1 & 0xf0 | 5;
    buf_ = (uchar *)this->_ip;
    bVar1 = *buf_;
  }
  if ((bVar1 & 0xf0) != 0x40) {
    *buf_ = bVar1 & 0xf | 0x40;
    bVar1 = *(byte *)this->_ip;
  }
  (this->super_packet_header)._len = (ulong)(byte)((bVar1 & 0xf) << 2);
  return;
}

Assistant:

explicit packet_header(const unsigned char* buf_)
				: _buf(buf_) { }